

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Header.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::LE_Header::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,LE_Header *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Subprotocol:    ",0x10);
  local_1e0._M_dataplus._M_p._0_1_ = (this->super_Header).super_Header6.m_ui8Padding1;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Live Entity ID: ",0x10);
  DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&local_1e0,&this->m_EntID);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(char *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,
                                     (KUINT8)local_1e0._M_dataplus._M_p),local_1e0._M_string_length)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,(KUINT8)local_1e0._M_dataplus._M_p) !=
      &local_1e0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1e0._M_dataplus._M_p._1_7_,(KUINT8)local_1e0._M_dataplus._M_p),
                    local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString LE_Header::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "Subprotocol:    " << m_ui8Padding1
       << "Live Entity ID: " << m_EntID.GetAsString();

    return ss.str();
}